

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::DisplayFinalEntries(cmComputeLinkDepends *this)

{
  FILE *pFVar1;
  string *psVar2;
  pointer pLVar3;
  char *__format;
  pointer pLVar4;
  
  pFVar1 = _stderr;
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  fprintf(pFVar1,"target [%s] links to:\n",(psVar2->_M_dataplus)._M_p);
  for (pLVar4 = (this->FinalLinkEntries).
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar1 = _stderr,
      pLVar4 != (this->FinalLinkEntries).
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish; pLVar4 = pLVar4 + 1) {
    __format = "  item [%s]\n";
    pLVar3 = pLVar4;
    if (pLVar4->Target != (cmGeneratorTarget *)0x0) {
      pLVar3 = (pointer)cmGeneratorTarget::GetName_abi_cxx11_(pLVar4->Target);
      __format = "  target [%s]\n";
    }
    fprintf(pFVar1,__format,(pLVar3->Item)._M_dataplus._M_p);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayFinalEntries()
{
  fprintf(stderr, "target [%s] links to:\n", this->Target->GetName().c_str());
  for (std::vector<LinkEntry>::const_iterator lei =
         this->FinalLinkEntries.begin();
       lei != this->FinalLinkEntries.end(); ++lei) {
    if (lei->Target) {
      fprintf(stderr, "  target [%s]\n", lei->Target->GetName().c_str());
    } else {
      fprintf(stderr, "  item [%s]\n", lei->Item.c_str());
    }
  }
  fprintf(stderr, "\n");
}